

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StreamInput *
pegmatite::StreamInput::Create(StreamInput *__return_storage_ptr__,string *name,istream *s)

{
  undefined1 auVar1 [16];
  fpos<__mbstate_t> local_60;
  fpos<__mbstate_t> local_50;
  size_t local_40;
  streamoff len;
  undefined8 local_30;
  streamoff local_28;
  streamoff start;
  istream *s_local;
  string *name_local;
  
  start = (streamoff)s;
  s_local = (istream *)name;
  name_local = (string *)__return_storage_ptr__;
  auVar1 = std::istream::tellg();
  local_30 = auVar1._8_8_;
  len = auVar1._0_8_;
  local_28 = std::fpos::operator_cast_to_long((fpos *)&len);
  std::istream::seekg(start,_S_beg);
  local_60 = (fpos<__mbstate_t>)std::istream::tellg();
  local_50 = std::fpos<__mbstate_t>::operator-(&local_60,local_28);
  local_40 = std::fpos::operator_cast_to_long((fpos *)&local_50);
  std::istream::seekg(start,(_Ios_Seekdir)local_28);
  StreamInput(__return_storage_ptr__,(string *)s_local,(istream *)start,local_40);
  return __return_storage_ptr__;
}

Assistant:

StreamInput StreamInput::Create(const std::string& name, std::istream& s)
{
	const std::streamoff start = s.tellg();
	s.seekg(0, std::ios::end);

	const std::streamoff len = s.tellg() - start;
	s.seekg(start, std::ios::beg);

	return StreamInput(name, s, static_cast<size_t>(len));
}